

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O0

Abc_Cex_t * Abc_CexPermuteTwo(Abc_Cex_t *p,Vec_Int_t *vPermOld,Vec_Int_t *vPermNew)

{
  int iVar1;
  int Entry;
  Vec_Int_t *p_00;
  Abc_Cex_t *pAVar2;
  int eNew;
  int eOld;
  int i;
  Vec_Int_t *vPerm;
  Abc_Cex_t *pCex;
  Vec_Int_t *vPermNew_local;
  Vec_Int_t *vPermOld_local;
  Abc_Cex_t *p_local;
  
  iVar1 = Vec_IntSize(vPermOld);
  if (iVar1 != p->nPis) {
    __assert_fail("Vec_IntSize(vPermOld) == p->nPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x208,"Abc_Cex_t *Abc_CexPermuteTwo(Abc_Cex_t *, Vec_Int_t *, Vec_Int_t *)");
  }
  iVar1 = Vec_IntSize(vPermNew);
  if (iVar1 == p->nPis) {
    p_00 = Vec_IntStartFull(p->nPis);
    for (eNew = 0; iVar1 = Vec_IntSize(vPermOld), eNew < iVar1; eNew = eNew + 1) {
      iVar1 = Vec_IntEntry(vPermOld,eNew);
      Entry = Vec_IntEntry(vPermNew,eNew);
      Vec_IntWriteEntry(p_00,iVar1,Entry);
    }
    pAVar2 = Abc_CexPermute(p,p_00);
    Vec_IntFree(p_00);
    return pAVar2;
  }
  __assert_fail("Vec_IntSize(vPermNew) == p->nPis",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                ,0x209,"Abc_Cex_t *Abc_CexPermuteTwo(Abc_Cex_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Abc_Cex_t * Abc_CexPermuteTwo( Abc_Cex_t * p, Vec_Int_t * vPermOld, Vec_Int_t * vPermNew )
{
    Abc_Cex_t * pCex;
    Vec_Int_t * vPerm;
    int i, eOld, eNew;
    assert( Vec_IntSize(vPermOld) == p->nPis );
    assert( Vec_IntSize(vPermNew) == p->nPis );
    vPerm = Vec_IntStartFull( p->nPis );
    Vec_IntForEachEntryTwo( vPermOld, vPermNew, eOld, eNew, i )
        Vec_IntWriteEntry( vPerm, eOld, eNew );
    pCex = Abc_CexPermute( p, vPerm );
    Vec_IntFree( vPerm );
    return pCex;
}